

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

bool __thiscall cmGraphVizWriter::IgnoreThisTarget(cmGraphVizWriter *this,string *name)

{
  bool bVar1;
  reference this_00;
  RegularExpression *regEx;
  __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
  local_28;
  iterator itvIt;
  string *name_local;
  cmGraphVizWriter *this_local;
  
  itvIt._M_current = (RegularExpression *)name;
  local_28._M_current =
       (RegularExpression *)
       std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::begin
                 (&this->TargetsToIgnoreRegex);
  while( true ) {
    regEx = (RegularExpression *)
            std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                      (&this->TargetsToIgnoreRegex);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                        *)&regEx);
    if (!bVar1) {
      return false;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
              ::operator*(&local_28);
    bVar1 = cmsys::RegularExpression::is_valid(this_00);
    if ((bVar1) &&
       (bVar1 = cmsys::RegularExpression::find(this_00,(string *)itvIt._M_current), bVar1)) break;
    __gnu_cxx::
    __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
    ::operator++(&local_28);
  }
  return true;
}

Assistant:

bool cmGraphVizWriter::IgnoreThisTarget(const std::string& name)
{
  for(std::vector<cmsys::RegularExpression>::iterator itvIt
                                          = this->TargetsToIgnoreRegex.begin();
      itvIt != this->TargetsToIgnoreRegex.end();
      ++ itvIt )
    {
    cmsys::RegularExpression& regEx = *itvIt;
    if (regEx.is_valid())
      {
      if (regEx.find(name))
        {
        return true;
        }
      }
    }

  return false;
}